

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

void __thiscall Character::PlayBard(Character *this,uchar instrument,uchar note,bool echo)

{
  Character *other;
  bool bVar1;
  int iVar2;
  list<Character_*,_std::allocator<Character_*>_> *this_00;
  reference ppCVar3;
  Character *character;
  iterator __end1;
  iterator __begin1;
  list<Character_*,_std::allocator<Character_*>_> *__range1;
  undefined1 local_48 [8];
  PacketBuilder builder;
  bool echo_local;
  uchar note_local;
  uchar instrument_local;
  Character *this_local;
  
  builder.add_size._5_1_ = echo;
  builder.add_size._6_1_ = note;
  builder.add_size._7_1_ = instrument;
  PacketBuilder::PacketBuilder((PacketBuilder *)local_48,PACKET_JUKEBOX,PACKET_MSG,5);
  iVar2 = PlayerID(this);
  PacketBuilder::AddShort((PacketBuilder *)local_48,(unsigned_short)iVar2);
  PacketBuilder::AddChar((PacketBuilder *)local_48,this->direction);
  PacketBuilder::AddChar((PacketBuilder *)local_48,builder.add_size._7_1_);
  PacketBuilder::AddChar((PacketBuilder *)local_48,builder.add_size._6_1_);
  this_00 = &this->map->characters;
  __end1 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(this_00);
  character = (Character *)
              std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end(this_00);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&character), bVar1) {
    ppCVar3 = std::_List_iterator<Character_*>::operator*(&__end1);
    other = *ppCVar3;
    if (((builder.add_size._5_1_ & 1) != 0) ||
       ((other != this && (bVar1 = InRange(this,other), bVar1)))) {
      Send(other,(PacketBuilder *)local_48);
    }
    std::_List_iterator<Character_*>::operator++(&__end1);
  }
  PacketBuilder::~PacketBuilder((PacketBuilder *)local_48);
  return;
}

Assistant:

void Character::PlayBard(unsigned char instrument, unsigned char note, bool echo)
{
	PacketBuilder builder(PACKET_JUKEBOX, PACKET_MSG, 5);

	builder.AddShort(this->PlayerID());
	builder.AddChar(this->direction);
	builder.AddChar(instrument);
	builder.AddChar(note);

	UTIL_FOREACH(this->map->characters, character)
	{
		if (!echo && (character == this || !this->InRange(character)))
		{
			continue;
		}

		character->Send(builder);
	}
}